

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nocpout.c
# Opt level: O2

void units_reg(void)

{
  Symbol *pSVar1;
  Item *pIVar2;
  double d2;
  double d1;
  char u [8192];
  double dStack_2048;
  double local_2040;
  char local_2038 [8200];
  
  lappendstr(defs_list,"static HocParmUnits _hoc_parm_units[] = {\n");
  pIVar2 = syminorder;
  while (pIVar2 = pIVar2->next, pIVar2 != syminorder) {
    pSVar1 = (pIVar2->element).sym;
    if (((pSVar1->nrntype & 0x40) != 0) &&
       (decode_ustr(pSVar1,&local_2040,&dStack_2048,local_2038), local_2038[0] != '\0')) {
      sprintf(buf,"\"%s%s\", \"%s\",\n",pSVar1->name,suffix,local_2038);
      lappendstr(defs_list,buf);
    }
  }
  pIVar2 = rangeparm;
  while (pIVar2 = pIVar2->next, pIVar2 != rangeparm) {
    pSVar1 = (pIVar2->element).sym;
    decode_ustr(pSVar1,&local_2040,&dStack_2048,local_2038);
    if (local_2038[0] != '\0') {
      sprintf(buf,"\"%s%s\", \"%s\",\n",pSVar1->name,rsuffix,local_2038);
      lappendstr(defs_list,buf);
    }
  }
  pIVar2 = rangestate;
  while (pIVar2 = pIVar2->next, pIVar2 != rangestate) {
    pSVar1 = (pIVar2->element).sym;
    decode_ustr(pSVar1,&local_2040,&dStack_2048,local_2038);
    if (local_2038[0] != '\0') {
      sprintf(buf,"\"%s%s\", \"%s\",\n",pSVar1->name,rsuffix,local_2038);
      lappendstr(defs_list,buf);
    }
  }
  pIVar2 = rangedep;
  while (pIVar2 = pIVar2->next, pIVar2 != rangedep) {
    pSVar1 = (pIVar2->element).sym;
    decode_ustr(pSVar1,&local_2040,&dStack_2048,local_2038);
    if (local_2038[0] != '\0') {
      sprintf(buf,"\"%s%s\", \"%s\",\n",pSVar1->name,rsuffix,local_2038);
      lappendstr(defs_list,buf);
    }
  }
  pIVar2 = nrnpointers;
  while (pIVar2 = pIVar2->next, pIVar2 != nrnpointers) {
    pSVar1 = (pIVar2->element).sym;
    decode_ustr(pSVar1,&local_2040,&dStack_2048,local_2038);
    if (local_2038[0] != '\0') {
      sprintf(buf,"\"%s%s\", \"%s\",\n",pSVar1->name,rsuffix,local_2038);
      lappendstr(defs_list,buf);
    }
  }
  lappendstr(defs_list,"0,0\n};\n");
  return;
}

Assistant:

void units_reg() {
	Symbol* s;
	Item* q;
	double d1, d2;
	char u[NRN_BUFSIZE];
	
	Lappendstr(defs_list, "static HocParmUnits _hoc_parm_units[] = {\n");
	ITERATE (q, syminorder) {
		s = SYM(q);
		if (s->nrntype & NRNGLOBAL) {
			decode_ustr(s, &d1, &d2, u);
			if (u[0]) {
				sprintf(buf, "\"%s%s\", \"%s\",\n", s->name, suffix, u);
				lappendstr(defs_list, buf);
			}
		}
	}
	ITERATE (q, rangeparm) {
		s = SYM(q);
		decode_ustr(s, &d1, &d2, u);
		if (u[0]) {
			sprintf(buf, "\"%s%s\", \"%s\",\n", s->name, rsuffix, u);
			lappendstr(defs_list, buf);
		}
	}
	ITERATE (q, rangestate) {
		s = SYM(q);
		decode_ustr(s, &d1, &d2, u);
		if (u[0]) {
			sprintf(buf, "\"%s%s\", \"%s\",\n", s->name, rsuffix, u);
			lappendstr(defs_list, buf);
		}
	}
	ITERATE (q, rangedep) {
		s = SYM(q);
		decode_ustr(s, &d1, &d2, u);
		if (u[0]) {
			sprintf(buf, "\"%s%s\", \"%s\",\n", s->name, rsuffix, u);
			lappendstr(defs_list, buf);
		}
	}
	ITERATE (q, nrnpointers) {
		s = SYM(q);
		decode_ustr(s, &d1, &d2, u);
		if (u[0]) {
			sprintf(buf, "\"%s%s\", \"%s\",\n", s->name, rsuffix, u);
			lappendstr(defs_list, buf);
		}
	}
	Lappendstr(defs_list, "0,0\n};\n");
}